

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O2

boolean jpeg_start_decompress(j_decompress_ptr cinfo)

{
  uint uVar1;
  jpeg_error_mgr *pjVar2;
  jpeg_progress_mgr *pjVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar4 = cinfo->global_state;
  if (iVar4 != 0xcc) {
    if (iVar4 == 0xcb) {
LAB_00109b14:
      if (cinfo->inputctl->has_multiple_scans != 0) {
        pjVar2 = cinfo->err;
        pjVar2->msg_code = 0x31;
        (*pjVar2->error_exit)((j_common_ptr)cinfo);
      }
      cinfo->output_scan_number = cinfo->input_scan_number;
    }
    else {
      if (iVar4 == 0xca) {
        jinit_master_decompress(cinfo);
        iVar4 = 0xcf;
        if (cinfo->buffered_image != 0) goto LAB_00109c08;
        cinfo->global_state = 0xcb;
        goto LAB_00109b14;
      }
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x15;
      (pjVar2->msg_parm).i[0] = iVar4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->global_state != 0xcc) {
      (*cinfo->master->prepare_for_output_pass)(cinfo);
      cinfo->output_scanline = 0;
      cinfo->global_state = 0xcc;
    }
  }
  while (cinfo->master->is_dummy_pass != 0) {
    uVar5 = cinfo->output_scanline;
    while (uVar1 = cinfo->output_height, uVar5 < uVar1) {
      pjVar3 = cinfo->progress;
      uVar6 = uVar5;
      if (pjVar3 != (jpeg_progress_mgr *)0x0) {
        pjVar3->pass_counter = (ulong)uVar5;
        pjVar3->pass_limit = (ulong)uVar1;
        (*pjVar3->progress_monitor)((j_common_ptr)cinfo);
        uVar6 = cinfo->output_scanline;
      }
      (*cinfo->main->process_data)(cinfo,(JSAMPARRAY)0x0,&cinfo->output_scanline,0);
      uVar5 = cinfo->output_scanline;
      if (uVar5 == uVar6) {
        return 0;
      }
    }
    (*cinfo->master->finish_output_pass)(cinfo);
    (*cinfo->master->prepare_for_output_pass)(cinfo);
    cinfo->output_scanline = 0;
  }
  iVar4 = 0xce - (uint)(cinfo->raw_data_out == 0);
LAB_00109c08:
  cinfo->global_state = iVar4;
  return 1;
}

Assistant:

GLOBAL(boolean)
jpeg_start_decompress (j_decompress_ptr cinfo)
{
  if (cinfo->global_state == DSTATE_READY) {
    /* First call: initialize master control, select active modules */
    jinit_master_decompress(cinfo);
    if (cinfo->buffered_image) {
      /* No more work here; expecting jpeg_start_output next */
      cinfo->global_state = DSTATE_BUFIMAGE;
      return TRUE;
    }
    cinfo->global_state = DSTATE_PRELOAD;
  }
  if (cinfo->global_state == DSTATE_PRELOAD) {
    /* If file has multiple scans, absorb them all into the coef buffer */
    if (cinfo->inputctl->has_multiple_scans) {
#ifdef D_MULTISCAN_FILES_SUPPORTED
      for (;;) {
	int retcode;
	/* Call progress monitor hook if present */
	if (cinfo->progress != NULL)
	  (*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
	/* Absorb some more input */
	retcode = (*cinfo->inputctl->consume_input) (cinfo);
	if (retcode == JPEG_SUSPENDED)
	  return FALSE;
	if (retcode == JPEG_REACHED_EOI)
	  break;
	/* Advance progress counter if appropriate */
	if (cinfo->progress != NULL &&
	    (retcode == JPEG_ROW_COMPLETED || retcode == JPEG_REACHED_SOS)) {
	  if (++cinfo->progress->pass_counter >= cinfo->progress->pass_limit) {
	    /* jdmaster underestimated number of scans; ratchet up one scan */
	    cinfo->progress->pass_limit += (long) cinfo->total_iMCU_rows;
	  }
	}
      }
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif /* D_MULTISCAN_FILES_SUPPORTED */
    }
    cinfo->output_scan_number = cinfo->input_scan_number;
  } else if (cinfo->global_state != DSTATE_PRESCAN)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  /* Perform any dummy output passes, and set up for the final pass */
  return output_pass_setup(cinfo);
}